

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5ParseTokenize(void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  u64 n;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  char *pcVar6;
  void *__s;
  size_t sVar7;
  undefined8 *pOld;
  long in_FS_OFFSET;
  int rc;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  iVar3 = *(int *)((long)pContext + 0x10);
  if (*(int *)((long)pContext + 0x10) != 0) goto LAB_001e4820;
  pOld = *pContext;
  iVar3 = 0x8000;
  if (nToken < 0x8000) {
    iVar3 = nToken;
  }
  iVar1 = 0;
  if (pOld == (undefined8 *)0x0) goto LAB_001e46b9;
  if (((tflags & 1U) == 0) || (*(int *)(pOld + 3) < 1)) {
    iVar1 = 0;
    if (pOld == (undefined8 *)0x0) {
LAB_001e46b9:
      iVar2 = sqlite3_initialize();
      if (iVar2 == 0) {
        puVar4 = (undefined8 *)sqlite3Realloc(pOld,(long)(iVar1 + 8) * 0x28 + 0x48);
      }
      else {
        puVar4 = (undefined8 *)0x0;
      }
      if (puVar4 == (undefined8 *)0x0) {
        local_3c = 7;
      }
      else {
        if (pOld == (undefined8 *)0x0) {
          puVar4[6] = 0;
          puVar4[7] = 0;
          puVar4[4] = 0;
          puVar4[5] = 0;
          puVar4[2] = 0;
          puVar4[3] = 0;
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4[8] = 0;
        }
        *(undefined8 **)pContext = puVar4;
        *(int *)(puVar4 + 3) = iVar1;
        pOld = puVar4;
      }
    }
    else if ((*(byte *)(pOld + 3) & 7) == 0) {
      if (pOld != (undefined8 *)0x0) {
        iVar1 = *(int *)(pOld + 3);
      }
      goto LAB_001e46b9;
    }
    if (local_3c == 0) {
      lVar5 = (long)*(int *)(pOld + 3);
      *(int *)(pOld + 3) = *(int *)(pOld + 3) + 1;
      pOld[lVar5 * 5 + 6] = 0;
      (pOld + lVar5 * 5 + 6)[1] = 0;
      pOld[lVar5 * 5 + 4] = 0;
      (pOld + lVar5 * 5 + 4)[1] = 0;
      pOld[lVar5 * 5 + 8] = 0;
      pcVar6 = sqlite3Fts5Strndup(&local_3c,pToken,iVar3);
      pOld[lVar5 * 5 + 5] = pcVar6;
      *(int *)(pOld + lVar5 * 5 + 6) = iVar3;
      *(int *)((long)pOld + lVar5 * 0x28 + 0x34) = iVar3;
      if ((*(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) && (local_3c == 0)) {
        sVar7 = strlen(pcVar6);
        *(int *)(pOld + lVar5 * 5 + 6) = (int)sVar7;
      }
    }
  }
  else {
    n = (long)iVar3 + 0x39;
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      __s = sqlite3Malloc(n);
    }
    else {
      __s = (void *)0x0;
    }
    if (__s == (void *)0x0) {
      local_3c = 7;
    }
    else {
      memset(__s,0,n);
      pcVar6 = (char *)((long)__s + 0x38);
      *(char **)((long)__s + 8) = pcVar6;
      *(int *)((long)__s + 0x10) = iVar3;
      *(int *)((long)__s + 0x14) = iVar3;
      if (*(int *)(*(long *)((long)pContext + 8) + 0x6c) != 0) {
        sVar7 = strlen(pcVar6);
        *(int *)((long)__s + 0x10) = (int)sVar7;
      }
      memcpy(pcVar6,pToken,(long)iVar3);
      iVar3 = *(int *)(pOld + 3);
      *(undefined8 *)((long)__s + 0x20) = pOld[(long)iVar3 * 5 + 3];
      pOld[(long)iVar3 * 5 + 3] = __s;
    }
  }
  *(int *)((long)pContext + 0x10) = local_3c;
  iVar3 = local_3c;
LAB_001e4820:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int fts5ParseTokenize(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  int rc = SQLITE_OK;
  const int SZALLOC = 8;
  TokenCtx *pCtx = (TokenCtx*)pContext;
  Fts5ExprPhrase *pPhrase = pCtx->pPhrase;

  UNUSED_PARAM2(iUnused1, iUnused2);

  /* If an error has already occurred, this is a no-op */
  if( pCtx->rc!=SQLITE_OK ) return pCtx->rc;
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;

  if( pPhrase && pPhrase->nTerm>0 && (tflags & FTS5_TOKEN_COLOCATED) ){
    Fts5ExprTerm *pSyn;
    sqlite3_int64 nByte = sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer) + nToken+1;
    pSyn = (Fts5ExprTerm*)sqlite3_malloc64(nByte);
    if( pSyn==0 ){
      rc = SQLITE_NOMEM;
    }else{
      memset(pSyn, 0, (size_t)nByte);
      pSyn->pTerm = ((char*)pSyn) + sizeof(Fts5ExprTerm) + sizeof(Fts5Buffer);
      pSyn->nFullTerm = pSyn->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata ){
        pSyn->nQueryTerm = (int)strlen(pSyn->pTerm);
      }
      memcpy(pSyn->pTerm, pToken, nToken);
      pSyn->pSynonym = pPhrase->aTerm[pPhrase->nTerm-1].pSynonym;
      pPhrase->aTerm[pPhrase->nTerm-1].pSynonym = pSyn;
    }
  }else{
    Fts5ExprTerm *pTerm;
    if( pPhrase==0 || (pPhrase->nTerm % SZALLOC)==0 ){
      Fts5ExprPhrase *pNew;
      int nNew = SZALLOC + (pPhrase ? pPhrase->nTerm : 0);

      pNew = (Fts5ExprPhrase*)sqlite3_realloc64(pPhrase,
          sizeof(Fts5ExprPhrase) + sizeof(Fts5ExprTerm) * nNew
      );
      if( pNew==0 ){
        rc = SQLITE_NOMEM;
      }else{
        if( pPhrase==0 ) memset(pNew, 0, sizeof(Fts5ExprPhrase));
        pCtx->pPhrase = pPhrase = pNew;
        pNew->nTerm = nNew - SZALLOC;
      }
    }

    if( rc==SQLITE_OK ){
      pTerm = &pPhrase->aTerm[pPhrase->nTerm++];
      memset(pTerm, 0, sizeof(Fts5ExprTerm));
      pTerm->pTerm = sqlite3Fts5Strndup(&rc, pToken, nToken);
      pTerm->nFullTerm = pTerm->nQueryTerm = nToken;
      if( pCtx->pConfig->bTokendata && rc==SQLITE_OK ){
        pTerm->nQueryTerm = (int)strlen(pTerm->pTerm);
      }
    }
  }

  pCtx->rc = rc;
  return rc;
}